

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> __thiscall
anon_unknown.dwarf_20eac1::LocalFileSystem::getFileContents(LocalFileSystem *this,string *path)

{
  _func_int **pp_Var1;
  string *in_RDX;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_48;
  byte local_38;
  Twine local_30;
  
  llvm::Twine::Twine(&local_30,in_RDX);
  llvm::MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_48.TStorage,&local_30,-1,true,false);
  if ((local_38 & 1) == 0) {
    pp_Var1 = (_func_int **)CONCAT44(local_48._4_4_,local_48._0_4_);
  }
  else {
    if (local_48._0_4_ == 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                    ,0xf4,
                    "storage_type *llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>>::getStorage() [T = std::unique_ptr<llvm::MemoryBuffer>]"
                   );
    }
    pp_Var1 = (_func_int **)0x0;
  }
  (this->super_FileSystem)._vptr_FileSystem = pp_Var1;
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         this;
}

Assistant:

virtual std::unique_ptr<llvm::MemoryBuffer>
  getFileContents(const std::string& path) override {
    auto result = llvm::MemoryBuffer::getFile(path);
    if (result.getError()) {
      return nullptr;
    }
    return std::unique_ptr<llvm::MemoryBuffer>(result->release());
  }